

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

Type __thiscall wasm::anon_unknown_0::TupleStore::insert(TupleStore *this,Tuple *info)

{
  int iVar1;
  iterator iVar2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *this_00;
  __hashtable *__h;
  uintptr_t uVar3;
  key_type local_60;
  ulong local_58;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_50;
  _Head_base<0UL,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_*,_false> local_38;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_50,info);
  uVar3 = (long)local_50.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar3 != 0) {
    if (uVar3 == 1) {
      uVar3 = (local_50.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->id;
      goto LAB_00cac4f1;
    }
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    local_60._M_data = &local_50;
    iVar2 = std::
            _Hashtable<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::hash<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->typeIDs)._M_h,&local_60);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)operator_new(0x18);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(this_00,info);
      uVar3 = (ulong)this_00 | 1;
      local_38._M_head_impl = this_00;
      if (uVar3 < 7) {
        __assert_fail("id > Type::_last_basic_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                      ,0x210,
                      "auto wasm::(anonymous namespace)::TupleStore::doInsert(const std::vector<wasm::Type> &)::(anonymous class)::operator()() const"
                     );
      }
      local_60._M_data = this_00;
      local_58 = uVar3;
      std::
      _Hashtable<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>,std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>,std::allocator<std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>>,std::hash<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>>
                ((_Hashtable<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>,std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>,std::allocator<std::pair<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>>,std::hash<std::reference_wrapper<std::vector<wasm::Type,std::allocator<wasm::Type>>const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->typeIDs);
      std::
      vector<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>,std::allocator<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>>>
      ::
      emplace_back<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>>
                ((vector<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>,std::allocator<std::unique_ptr<std::vector<wasm::Type,std::allocator<wasm::Type>>,std::default_delete<std::vector<wasm::Type,std::allocator<wasm::Type>>>>>>
                  *)&this->constructedTuples,
                 (unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                  *)&local_38);
      if (local_38._M_head_impl != (vector<wasm::Type,_std::allocator<wasm::Type>_> *)0x0) {
        std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::operator()
                  ((default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                   &local_38,local_38._M_head_impl);
      }
    }
    else {
      uVar3 = *(uintptr_t *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_true>
                      ._M_cur + 0x10);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  if (local_50.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return (Type)uVar3;
  }
LAB_00cac4f1:
  operator_delete(local_50.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_50.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage -
                  (long)local_50.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                        .super__Vector_impl_data._M_start);
  return (Type)uVar3;
}

Assistant:

Type insert(const Tuple& info) { return doInsert(info); }